

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_func_call_arg_abi_cxx11_
          (CompilerGLSL *this,Parameter *param_1,uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *type;
  SPIRVariable *pSVar3;
  uint32_t in_ECX;
  SPIRVariable *var;
  uint32_t name_id;
  uint32_t id_local;
  Parameter *param_1_local;
  CompilerGLSL *this_local;
  
  type = Compiler::expression_type((Compiler *)param_1,in_ECX);
  bVar1 = Compiler::is_physical_pointer((Compiler *)param_1,type);
  if (bVar1) {
    to_pointer_expression_abi_cxx11_(this,(uint32_t)param_1,SUB41(in_ECX,0));
  }
  else {
    pSVar3 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)param_1,in_ECX);
    var._0_4_ = in_ECX;
    if (pSVar3 != (SPIRVariable *)0x0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->basevariable);
      if (uVar2 != 0) {
        var._0_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar3->basevariable);
      }
    }
    to_unpacked_expression_abi_cxx11_(this,(uint32_t)param_1,SUB41((uint32_t)var,0));
  }
  return this;
}

Assistant:

string CompilerGLSL::to_func_call_arg(const SPIRFunction::Parameter &, uint32_t id)
{
	// BDA expects pointers through function interface.
	if (is_physical_pointer(expression_type(id)))
		return to_pointer_expression(id);

	// Make sure that we use the name of the original variable, and not the parameter alias.
	uint32_t name_id = id;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->basevariable)
		name_id = var->basevariable;
	return to_unpacked_expression(name_id);
}